

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregoimp.cpp
# Opt level: O2

void icu_63::Grego::dayToFields
               (double day,int32_t *year,int32_t *month,int32_t *dom,int32_t *dow,int32_t *doy)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  
  iVar2 = ClockMath::floorDivide(day + 719162.0,0x23ab1,doy);
  iVar3 = ClockMath::floorDivide((double)*doy,0x8eac,doy);
  iVar4 = ClockMath::floorDivide((double)*doy,0x5b5,doy);
  iVar5 = ClockMath::floorDivide((double)*doy,0x16d,doy);
  iVar7 = iVar3 * 100 + iVar2 * 400 + iVar4 * 4 + iVar5;
  *year = iVar7;
  if (iVar3 == 4 || iVar5 == 4) {
    *doy = 0x16d;
    iVar2 = *year;
  }
  else {
    iVar2 = iVar7 + 1;
    *year = iVar2;
  }
  UVar1 = isLeapYear(iVar2);
  dVar8 = uprv_fmod_63(day + 719162.0 + 1.0,7.0);
  iVar6 = (int)dVar8;
  iVar7 = iVar6 + 8;
  if (-1 < iVar6) {
    iVar7 = iVar6 + 1;
  }
  *dow = iVar7;
  iVar7 = 0;
  if ((int)(0x3c - (uint)(UVar1 == '\0')) <= *doy) {
    iVar7 = (UVar1 == '\0') + 1;
  }
  iVar7 = ((iVar7 + *doy) * 0xc + 6) / 0x16f;
  *month = iVar7;
  iVar6 = iVar7 + 0xc;
  if (UVar1 == '\0') {
    iVar6 = iVar7;
  }
  *dom = (*doy - (int)*(short *)(DAYS_BEFORE + (long)iVar6 * 2)) + 1;
  *doy = *doy + 1;
  return;
}

Assistant:

void Grego::dayToFields(double day, int32_t& year, int32_t& month,
                        int32_t& dom, int32_t& dow, int32_t& doy) {

    // Convert from 1970 CE epoch to 1 CE epoch (Gregorian calendar)
    day += JULIAN_1970_CE - JULIAN_1_CE;

    // Convert from the day number to the multiple radix
    // representation.  We use 400-year, 100-year, and 4-year cycles.
    // For example, the 4-year cycle has 4 years + 1 leap day; giving
    // 1461 == 365*4 + 1 days.
    int32_t n400 = ClockMath::floorDivide(day, 146097, doy); // 400-year cycle length
    int32_t n100 = ClockMath::floorDivide(doy, 36524, doy); // 100-year cycle length
    int32_t n4   = ClockMath::floorDivide(doy, 1461, doy); // 4-year cycle length
    int32_t n1   = ClockMath::floorDivide(doy, 365, doy);
    year = 400*n400 + 100*n100 + 4*n4 + n1;
    if (n100 == 4 || n1 == 4) {
        doy = 365; // Dec 31 at end of 4- or 400-year cycle
    } else {
        ++year;
    }
    
    UBool isLeap = isLeapYear(year);
    
    // Gregorian day zero is a Monday.
    dow = (int32_t) uprv_fmod(day + 1, 7);
    dow += (dow < 0) ? (UCAL_SUNDAY + 7) : UCAL_SUNDAY;

    // Common Julian/Gregorian calculation
    int32_t correction = 0;
    int32_t march1 = isLeap ? 60 : 59; // zero-based DOY for March 1
    if (doy >= march1) {
        correction = isLeap ? 1 : 2;
    }
    month = (12 * (doy + correction) + 6) / 367; // zero-based month
    dom = doy - DAYS_BEFORE[month + (isLeap ? 12 : 0)] + 1; // one-based DOM
    doy++; // one-based doy
}